

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

coop_repository_stats_t * __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::query_coop_repository_stats
          (coop_repository_stats_t *__return_storage_ptr__,mt_env_infrastructure_t *this)

{
  coop_repo_t::query_stats(__return_storage_ptr__,&this->m_coop_repo);
  return __return_storage_ptr__;
}

Assistant:

environment_infrastructure_t::coop_repository_stats_t
mt_env_infrastructure_t::query_coop_repository_stats()
	{
		return m_coop_repo.query_stats();
	}